

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O0

lattice_site __thiscall
sisl::body_centered_cubic<char>::get_dimensions(body_centered_cubic<char> *this)

{
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Index extraout_RDX;
  long in_RSI;
  lattice_site lVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_40;
  int local_20;
  undefined1 local_19;
  body_centered_cubic<char> *this_local;
  lattice_site *s;
  
  local_19 = 0;
  local_20 = 3;
  this_local = this;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>((Matrix<int,__1,_1,_0,__1,_1> *)this,&local_20);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_40,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)this,
             (Scalar *)(in_RSI + 8));
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_40,(Scalar *)(in_RSI + 0xc));
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
            (this_00,(Scalar *)(in_RSI + 0x10));
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_40);
  lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (lattice_site)lVar1.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const lattice_site get_dimensions() const {
            lattice_site s(3);
            s << _nx , _ny , _nz ;
            return s;
        }